

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall FPolyObj::UpdateBBox(FPolyObj *this)

{
  uint uVar1;
  line_t_conflict **pplVar2;
  uint local_14;
  uint i;
  FPolyObj *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<line_t_*,_line_t_*>::Size(&this->Linedefs);
    if (uVar1 <= local_14) break;
    pplVar2 = TArray<line_t_*,_line_t_*>::operator[](&this->Linedefs,(ulong)local_14);
    P_AdjustLine(*pplVar2);
    local_14 = local_14 + 1;
  }
  CalcCenter(this);
  return;
}

Assistant:

void FPolyObj::UpdateBBox ()
{
	for(unsigned i=0;i<Linedefs.Size(); i++)
	{
		P_AdjustLine(Linedefs[i]);
	}
	CalcCenter();
}